

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O3

Result<wasm::Memory_*> * __thiscall
wasm::WATParser::ParseDeclsCtx::addMemoryDecl
          (Result<wasm::Memory_*> *__return_storage_ptr__,ParseDeclsCtx *this,Index pos,Name name,
          ImportNames *importNames,MemType type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint __val;
  uint uVar3;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var4;
  _Storage<unsigned_long,_true> _Var5;
  Memory *pMVar6;
  long *plVar7;
  uint uVar8;
  char *pcVar9;
  ulong *puVar10;
  ulong uVar11;
  ImportNames *pIVar12;
  uint __len;
  string_view sVar13;
  string local_a8;
  long *local_88 [2];
  long local_78 [2];
  ImportNames *local_68;
  Err local_60;
  _Head_base<0UL,_wasm::Memory_*,_false> local_40;
  ParseDeclsCtx *local_38;
  
  local_68 = importNames;
  local_38 = this;
  _Var4._M_head_impl = (Memory *)operator_new(0x58);
  ((_Var4._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
  ((_Var4._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&((_Var4._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
  ((_Var4._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
  ((_Var4._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
  ((_Var4._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
  ((_Var4._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
  ((_Var4._M_head_impl)->initial).addr = 0;
  ((_Var4._M_head_impl)->max).addr = 0;
  *(undefined8 *)&(_Var4._M_head_impl)->shared = 0;
  ((_Var4._M_head_impl)->addressType).id = type.addressType.id;
  ((_Var4._M_head_impl)->initial).addr = type.limits.initial;
  _Var5._M_value = 0xffffffffffffffff;
  if (type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged != false) {
    _Var5._M_value =
         type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload._M_value;
  }
  ((_Var4._M_head_impl)->max).addr = (address64_t)_Var5;
  (_Var4._M_head_impl)->shared = type.shared;
  local_40._M_head_impl = _Var4._M_head_impl;
  if (name.super_IString.str._M_str == (char *)0x0) {
    uVar2 = local_38->memoryCounter;
    local_38->memoryCounter = uVar2 + 1;
    __val = -uVar2;
    if (0 < (int)uVar2) {
      __val = uVar2;
    }
    __len = 1;
    if (9 < __val) {
      uVar11 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar8 = (uint)uVar11;
        if (uVar8 < 100) {
          __len = __len - 2;
          goto LAB_00b7989b;
        }
        if (uVar8 < 1000) {
          __len = __len - 1;
          goto LAB_00b7989b;
        }
        if (uVar8 < 10000) goto LAB_00b7989b;
        uVar11 = uVar11 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar8);
      __len = __len + 1;
    }
LAB_00b7989b:
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct((ulong)local_88,(char)__len - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_88[0]),__len,__val);
    pIVar12 = local_68;
    pcVar9 = "mimport$";
    if (local_68 == (ImportNames *)0x0) {
      pcVar9 = "";
    }
    plVar7 = (long *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,(ulong)pcVar9);
    paVar1 = &local_60.msg.field_2;
    puVar10 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_60.msg.field_2._M_allocated_capacity = *puVar10;
      local_60.msg.field_2._8_8_ = plVar7[3];
      local_60.msg._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_60.msg.field_2._M_allocated_capacity = *puVar10;
      local_60.msg._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_60.msg._M_string_length = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    sVar13._M_str = (char *)0x0;
    sVar13._M_len = (size_t)local_60.msg._M_dataplus._M_p;
    sVar13 = IString::interned((IString *)local_60.msg._M_string_length,sVar13,SUB81(puVar10,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.msg._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.msg._M_dataplus._M_p,local_60.msg.field_2._M_allocated_capacity + 1);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0],local_78[0] + 1);
    }
    sVar13 = (string_view)Names::getValidMemoryName(local_38->wasm,(Name)sVar13);
    ((local_40._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar13;
    _Var4._M_head_impl = local_40._M_head_impl;
  }
  else {
    pMVar6 = Module::getMemoryOrNull(local_38->wasm,name);
    if (pMVar6 != (Memory *)0x0) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"repeated memory name","")
      ;
      Lexer::err(&local_60,&local_38->in,(ulong)pos,&local_a8);
      puVar10 = (ulong *)((long)&(__return_storage_ptr__->val).
                                 super__Variant_base<wasm::Memory_*,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Memory_*,_wasm::Err> + 0x10);
      *(ulong **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Memory_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Memory_*,_wasm::Err> = puVar10;
      paVar1 = &local_60.msg.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.msg._M_dataplus._M_p == paVar1) {
        *puVar10 = local_60.msg.field_2._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Memory_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Memory_*,_wasm::Err> + 0x18) =
             local_60.msg.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Memory_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Memory_*,_wasm::Err> = local_60.msg._M_dataplus._M_p;
        *(size_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Memory_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Memory_*,_wasm::Err> + 0x10) =
             local_60.msg.field_2._M_allocated_capacity;
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Memory_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Memory_*,_wasm::Err> + 8) =
           local_60.msg._M_string_length;
      local_60.msg._M_string_length = 0;
      local_60.msg.field_2._M_allocated_capacity =
           local_60.msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Memory_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Memory_*,_wasm::Err> + 0x20) = '\x01';
      local_60.msg._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00b799dc;
    }
    ((_Var4._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
         name.super_IString.str._M_len;
    ((_Var4._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         name.super_IString.str._M_str;
    ((_Var4._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
    pIVar12 = local_68;
  }
  if (pIVar12 != (ImportNames *)0x0) {
    pcVar9 = (pIVar12->mod).super_IString.str._M_str;
    ((_Var4._M_head_impl)->super_Importable).module.super_IString.str._M_len =
         (pIVar12->mod).super_IString.str._M_len;
    ((_Var4._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar9;
    pcVar9 = (pIVar12->nm).super_IString.str._M_str;
    ((_Var4._M_head_impl)->super_Importable).base.super_IString.str._M_len =
         (pIVar12->nm).super_IString.str._M_len;
    ((_Var4._M_head_impl)->super_Importable).base.super_IString.str._M_str = pcVar9;
  }
  pMVar6 = Module::addMemory(local_38->wasm,
                             (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                             &local_40);
  *(Memory **)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::Memory_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Memory_*,_wasm::Err> = pMVar6;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Memory_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Memory_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Memory_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Memory_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Memory_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Memory_*,_wasm::Err> + 0x20) = '\0';
  _Var4._M_head_impl = local_40._M_head_impl;
  if (local_40._M_head_impl == (Memory *)0x0) {
    return __return_storage_ptr__;
  }
LAB_00b799dc:
  operator_delete(_Var4._M_head_impl,0x58);
  return __return_storage_ptr__;
}

Assistant:

Result<Memory*> ParseDeclsCtx::addMemoryDecl(Index pos,
                                             Name name,
                                             ImportNames* importNames,
                                             MemType type) {
  auto m = std::make_unique<Memory>();
  m->addressType = type.addressType;
  m->initial = type.limits.initial;
  m->max = type.limits.max ? *type.limits.max : Memory::kUnlimitedSize;
  m->shared = type.shared;
  if (name) {
    // TODO: if the existing memory is not explicitly named, fix its name
    // and continue.
    if (wasm.getMemoryOrNull(name)) {
      return in.err(pos, "repeated memory name");
    }
    m->setExplicitName(name);
  } else {
    name = (importNames ? "mimport$" : "") + std::to_string(memoryCounter++);
    name = Names::getValidMemoryName(wasm, name);
    m->name = name;
  }
  applyImportNames(*m, importNames);
  return wasm.addMemory(std::move(m));
}